

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getFreeFloatingMassMatrix
          (KinDynComputations *this,MatrixDynSize *freeFloatingMassMatrix)

{
  long lVar1;
  pointer peVar2;
  index_type iVar3;
  bool bVar4;
  MatrixView<double> local_90;
  MatrixView<double> local_60;
  
  lVar1 = iDynTree::Model::getNrOfDOFs();
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)freeFloatingMassMatrix,lVar1 + 6);
  peVar2 = (pointer)iDynTree::MatrixDynSize::data();
  iVar3 = iDynTree::MatrixDynSize::rows();
  local_60.m_cols = iDynTree::MatrixDynSize::cols();
  local_60.m_storageOrder = RowMajor;
  local_60.m_innerStride = 1;
  local_60.m_storage = peVar2;
  local_60.m_rows = iVar3;
  local_60.m_outerStride = local_60.m_cols;
  getFreeFloatingMassMatrix(this,&local_60);
  peVar2 = (pointer)iDynTree::MatrixDynSize::data();
  iVar3 = iDynTree::MatrixDynSize::rows();
  local_90.m_cols = iDynTree::MatrixDynSize::cols();
  local_90.m_storageOrder = RowMajor;
  local_90.m_innerStride = 1;
  local_90.m_storage = peVar2;
  local_90.m_rows = iVar3;
  local_90.m_outerStride = local_90.m_cols;
  bVar4 = getFreeFloatingMassMatrix(this,&local_90);
  return bVar4;
}

Assistant:

bool KinDynComputations::getFreeFloatingMassMatrix(MatrixDynSize& freeFloatingMassMatrix)
{
    // If the matrix has the right size, this should be inexpensive
    freeFloatingMassMatrix.resize(pimpl->m_robot_model.getNrOfDOFs()+6,pimpl->m_robot_model.getNrOfDOFs()+6);

    this->getFreeFloatingMassMatrix(MatrixView<double>(freeFloatingMassMatrix));

    // Return
    return this->getFreeFloatingMassMatrix(MatrixView<double>(freeFloatingMassMatrix));
}